

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O0

bool __thiscall ON_Sun::CImpl::SetLocalDateTime(CImpl *this,int year,int month,int day,double hours)

{
  int *piVar1;
  wchar_t *pwVar2;
  ON_XMLVariant local_438;
  ON_XMLVariant local_340;
  ON_XMLVariant local_248;
  ON_XMLVariant local_140;
  wchar_t *local_48;
  wchar_t *s;
  int local_38 [3];
  int local_2c;
  double local_28;
  double hours_local;
  int local_18;
  int day_local;
  int month_local;
  int year_local;
  CImpl *this_local;
  
  local_28 = hours;
  hours_local._4_4_ = day;
  local_18 = month;
  day_local = year;
  _month_local = this;
  local_2c = MinYear();
  local_38[2] = MaxYear();
  piVar1 = std::min<int>(local_38 + 2,&day_local);
  piVar1 = std::max<int>(&local_2c,piVar1);
  day_local = *piVar1;
  local_38[1] = 1;
  local_38[0] = 0xc;
  piVar1 = std::min<int>(local_38,&local_18);
  piVar1 = std::max<int>(local_38 + 1,piVar1);
  local_18 = *piVar1;
  s._4_4_ = 1;
  s._0_4_ = ON_SunEngine::DaysInMonth(local_18,day_local);
  piVar1 = std::min<int>((int *)&s,(int *)((long)&hours_local + 4));
  piVar1 = std::max<int>((int *)((long)&s + 4),piVar1);
  hours_local._4_4_ = *piVar1;
  pwVar2 = XMLPath_Sun();
  local_48 = pwVar2;
  ::ON_XMLVariant::ON_XMLVariant(&local_140,day_local);
  ON_InternalXMLImpl::SetParameter(&this->super_ON_InternalXMLImpl,pwVar2,L"year",&local_140);
  ::ON_XMLVariant::~ON_XMLVariant(&local_140);
  pwVar2 = local_48;
  ::ON_XMLVariant::ON_XMLVariant(&local_248,local_18);
  ON_InternalXMLImpl::SetParameter(&this->super_ON_InternalXMLImpl,pwVar2,L"month",&local_248);
  ::ON_XMLVariant::~ON_XMLVariant(&local_248);
  pwVar2 = local_48;
  ::ON_XMLVariant::ON_XMLVariant(&local_340,hours_local._4_4_);
  ON_InternalXMLImpl::SetParameter(&this->super_ON_InternalXMLImpl,pwVar2,L"day",&local_340);
  ::ON_XMLVariant::~ON_XMLVariant(&local_340);
  pwVar2 = local_48;
  ::ON_XMLVariant::ON_XMLVariant(&local_438,local_28);
  ON_InternalXMLImpl::SetParameter(&this->super_ON_InternalXMLImpl,pwVar2,L"time",&local_438);
  ::ON_XMLVariant::~ON_XMLVariant(&local_438);
  this->_calc_dirty = true;
  return true;
}

Assistant:

bool ON_Sun::CImpl::SetLocalDateTime(int year, int month, int day, double hours)
{
  year  = std::max(MinYear(), std::min(MaxYear(), year));
  month = std::max(1, std::min(12, month));
  day   = std::max(1, std::min(ON_SunEngine::DaysInMonth(month, year), day));

  const wchar_t* s = XMLPath_Sun();
  SetParameter(s, ON_RDK_SUN_DATE_YEAR,  year);
  SetParameter(s, ON_RDK_SUN_DATE_MONTH, month);
  SetParameter(s, ON_RDK_SUN_DATE_DAY,   day);
  SetParameter(s, ON_RDK_SUN_TIME_HOURS, hours);

  _calc_dirty = true;

  return true;
}